

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

void __thiscall indigox::Molecule::ResetIndices(Molecule *this)

{
  pointer psVar1;
  pointer psVar2;
  uid_t local_20;
  
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->idx_to_atom_)._M_h);
  local_20 = 0;
  while( true ) {
    psVar1 = (this->atoms_).
             super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= local_20)
    break;
    Atom::SetIndex(psVar1[local_20].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_20);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long&,std::shared_ptr<indigox::Atom>&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->idx_to_atom_,&local_20,
               (this->atoms_).
               super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_20);
    local_20 = local_20 + 1;
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->idx_to_bond_)._M_h);
  local_20 = 0;
  while( true ) {
    psVar2 = (this->bonds_).
             super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->bonds_).
                      super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= local_20)
    break;
    Bond::SetIndex(psVar2[local_20].super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_20);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long&,std::shared_ptr<indigox::Bond>&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->idx_to_bond_,&local_20,
               (this->bonds_).
               super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_20);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Molecule::ResetIndices() {
  idx_to_atom_.clear();
  for (uid_t i = 0; i < atoms_.size(); ++i) {
    atoms_[i]->SetIndex(i);
    idx_to_atom_.emplace(i, atoms_[i]);
  }
  
  idx_to_bond_.clear();
  for (uid_t i = 0; i < bonds_.size(); ++i) {
    bonds_[i]->SetIndex(i);
    idx_to_bond_.emplace(i, bonds_[i]);
  }
}